

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterBuffer.h
# Opt level: O0

hash_t JsUtil::CharacterBuffer<char>::InternalGetHashCode<false>(char *s,charcount_t length)

{
  uint local_20;
  charcount_t i;
  charcount_t hashLength;
  hash_t hash;
  charcount_t length_local;
  char *s_local;
  
  i = 0x811c9dc5;
  for (local_20 = 0; local_20 < length; local_20 = local_20 + 1) {
    i = ((int)s[local_20] ^ i) * 0x1000193;
  }
  return i;
}

Assistant:

static hash_t InternalGetHashCode(__in_z T const * s, __in charcount_t length)
        {
            hash_t hash = CC_HASH_OFFSET_VALUE;
            charcount_t hashLength = length;
            if (fastHash)
            {
                hashLength = min(length, MAX_FAST_HASH_LENGTH);
            }
            for (charcount_t i = 0; i < hashLength; i++)
            {
                CC_HASH_LOGIC(hash, s[i]);
            }
            return hash;
        }